

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thermoParser.cpp
# Opt level: O0

bool __thiscall IO::ThermoParser::setThermoDataFor(ThermoParser *this,Species *species)

{
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  string *str;
  Thermo *this_00;
  string local_68;
  string local_48;
  ulong local_28;
  size_t i;
  Species *species_local;
  ThermoParser *this_local;
  
  local_28 = 0;
  i = (size_t)species;
  species_local = (Species *)this;
  while( true ) {
    uVar1 = local_28;
    sVar3 = std::vector<IO::Thermo,_std::allocator<IO::Thermo>_>::size(&this->thermos_);
    if (sVar3 <= uVar1) {
      return false;
    }
    pvVar4 = std::vector<IO::Thermo,_std::allocator<IO::Thermo>_>::operator[]
                       (&this->thermos_,local_28);
    str = Thermo::getSpeciesName_abi_cxx11_(pvVar4);
    convertToCaps(&local_48,str);
    Species::name_abi_cxx11_(&local_68,(Species *)i);
    iVar2 = std::__cxx11::string::compare((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    if (iVar2 == 0) break;
    local_28 = local_28 + 1;
  }
  pvVar4 = std::vector<IO::Thermo,_std::allocator<IO::Thermo>_>::operator[]
                     (&this->thermos_,local_28);
  this_00 = Species::thermo((Species *)i);
  Thermo::operator=(this_00,pvVar4);
  return true;
}

Assistant:

bool IO::ThermoParser::setThermoDataFor(IO::Species& species) {
    for (size_t i = 0; i < thermos_.size(); ++i) {
        if (convertToCaps(thermos_[i].getSpeciesName()).compare(species.name()) == 0) {
            species.thermo() = thermos_[i];
            return true;
        }
    }
    return false;
}